

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_blend_popcnt(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  
  auVar35 = _DAT_0011d0c0;
  auVar34 = _DAT_0011d0a0;
  if (len < 0x20) {
    uVar38 = 0;
  }
  else {
    uVar37 = 0;
    uVar36 = 2;
    do {
      uVar38 = uVar36;
      lVar39 = 0x20;
      auVar40 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar37 * 0x10),auVar34,
                                  *(undefined1 (*) [32])(array + uVar37 * 0x10 + 0x10));
      auVar41 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar37 * 0x10 + 0x10),auVar35,
                                  *(undefined1 (*) [32])(array + uVar37 * 0x10));
      do {
        auVar2 = auVar40 >> 7;
        auVar3 = auVar40 >> 0xf;
        auVar4 = auVar40 >> 0x17;
        auVar5 = auVar40 >> 0x1f;
        auVar6 = auVar40 >> 0x27;
        auVar7 = auVar40 >> 0x2f;
        auVar8 = auVar40 >> 0x37;
        auVar9 = auVar40 >> 0x3f;
        auVar10 = auVar40 >> 0x47;
        auVar11 = auVar40 >> 0x4f;
        auVar12 = auVar40 >> 0x57;
        auVar13 = auVar40 >> 0x5f;
        auVar14 = auVar40 >> 0x67;
        auVar15 = auVar40 >> 0x6f;
        auVar16 = auVar40 >> 0x77;
        auVar17 = auVar40 >> 0x7f;
        auVar18 = auVar40 >> 0x87;
        auVar19 = auVar40 >> 0x8f;
        auVar20 = auVar40 >> 0x97;
        auVar21 = auVar40 >> 0x9f;
        auVar22 = auVar40 >> 0xa7;
        auVar23 = auVar40 >> 0xaf;
        auVar24 = auVar40 >> 0xb7;
        auVar25 = auVar40 >> 0xbf;
        auVar26 = auVar40 >> 199;
        auVar27 = auVar40 >> 0xcf;
        auVar28 = auVar40 >> 0xd7;
        auVar29 = auVar40 >> 0xdf;
        auVar30 = auVar40 >> 0xe7;
        auVar31 = auVar40 >> 0xef;
        auVar32 = auVar40 >> 0xf7;
        bVar33 = auVar40[0x1f];
        auVar40 = vpaddb_avx2(auVar40,auVar40);
        piVar1 = (int *)((long)flags + lVar39 + -4);
        *piVar1 = *piVar1 + POPCOUNT((uint)(auVar2[0] & 1) | (uint)(auVar3[0] & 1) << 1 |
                                     (uint)(auVar4[0] & 1) << 2 | (uint)(auVar5[0] & 1) << 3 |
                                     (uint)(auVar6[0] & 1) << 4 | (uint)(auVar7[0] & 1) << 5 |
                                     (uint)(auVar8[0] & 1) << 6 | (uint)(auVar9[0] & 1) << 7 |
                                     (uint)(auVar10[0] & 1) << 8 | (uint)(auVar11[0] & 1) << 9 |
                                     (uint)(auVar12[0] & 1) << 10 | (uint)(auVar13[0] & 1) << 0xb |
                                     (uint)(auVar14[0] & 1) << 0xc | (uint)(auVar15[0] & 1) << 0xd |
                                     (uint)(auVar16[0] & 1) << 0xe | (uint)auVar17[0] << 0xf |
                                     (uint)(auVar18[0] & 1) << 0x10 | (uint)(auVar19[0] & 1) << 0x11
                                     | (uint)(auVar20[0] & 1) << 0x12 |
                                     (uint)(auVar21[0] & 1) << 0x13 | (uint)(auVar22[0] & 1) << 0x14
                                     | (uint)(auVar23[0] & 1) << 0x15 |
                                     (uint)(auVar24[0] & 1) << 0x16 | (uint)auVar25[0] << 0x17 |
                                     (uint)(auVar26[0] & 1) << 0x18 | (uint)(auVar27[0] & 1) << 0x19
                                     | (uint)(auVar28[0] & 1) << 0x1a |
                                     (uint)(auVar29[0] & 1) << 0x1b | (uint)(auVar30[0] & 1) << 0x1c
                                     | (uint)(auVar31[0] & 1) << 0x1d |
                                     (uint)(auVar32[0] & 1) << 0x1e | (uint)(bVar33 >> 7) << 0x1f);
        auVar2 = auVar41 >> 7;
        auVar3 = auVar41 >> 0xf;
        auVar4 = auVar41 >> 0x17;
        auVar5 = auVar41 >> 0x1f;
        auVar6 = auVar41 >> 0x27;
        auVar7 = auVar41 >> 0x2f;
        auVar8 = auVar41 >> 0x37;
        auVar9 = auVar41 >> 0x3f;
        auVar10 = auVar41 >> 0x47;
        auVar11 = auVar41 >> 0x4f;
        auVar12 = auVar41 >> 0x57;
        auVar13 = auVar41 >> 0x5f;
        auVar14 = auVar41 >> 0x67;
        auVar15 = auVar41 >> 0x6f;
        auVar16 = auVar41 >> 0x77;
        auVar17 = auVar41 >> 0x7f;
        auVar18 = auVar41 >> 0x87;
        auVar19 = auVar41 >> 0x8f;
        auVar20 = auVar41 >> 0x97;
        auVar21 = auVar41 >> 0x9f;
        auVar22 = auVar41 >> 0xa7;
        auVar23 = auVar41 >> 0xaf;
        auVar24 = auVar41 >> 0xb7;
        auVar25 = auVar41 >> 0xbf;
        auVar26 = auVar41 >> 199;
        auVar27 = auVar41 >> 0xcf;
        auVar28 = auVar41 >> 0xd7;
        auVar29 = auVar41 >> 0xdf;
        auVar30 = auVar41 >> 0xe7;
        auVar31 = auVar41 >> 0xef;
        auVar32 = auVar41 >> 0xf7;
        bVar33 = auVar41[0x1f];
        auVar41 = vpaddb_avx2(auVar41,auVar41);
        piVar1 = (int *)((long)flags + lVar39 + 0x1c);
        *piVar1 = *piVar1 + POPCOUNT((uint)(auVar2[0] & 1) | (uint)(auVar3[0] & 1) << 1 |
                                     (uint)(auVar4[0] & 1) << 2 | (uint)(auVar5[0] & 1) << 3 |
                                     (uint)(auVar6[0] & 1) << 4 | (uint)(auVar7[0] & 1) << 5 |
                                     (uint)(auVar8[0] & 1) << 6 | (uint)(auVar9[0] & 1) << 7 |
                                     (uint)(auVar10[0] & 1) << 8 | (uint)(auVar11[0] & 1) << 9 |
                                     (uint)(auVar12[0] & 1) << 10 | (uint)(auVar13[0] & 1) << 0xb |
                                     (uint)(auVar14[0] & 1) << 0xc | (uint)(auVar15[0] & 1) << 0xd |
                                     (uint)(auVar16[0] & 1) << 0xe | (uint)auVar17[0] << 0xf |
                                     (uint)(auVar18[0] & 1) << 0x10 | (uint)(auVar19[0] & 1) << 0x11
                                     | (uint)(auVar20[0] & 1) << 0x12 |
                                     (uint)(auVar21[0] & 1) << 0x13 | (uint)(auVar22[0] & 1) << 0x14
                                     | (uint)(auVar23[0] & 1) << 0x15 |
                                     (uint)(auVar24[0] & 1) << 0x16 | (uint)auVar25[0] << 0x17 |
                                     (uint)(auVar26[0] & 1) << 0x18 | (uint)(auVar27[0] & 1) << 0x19
                                     | (uint)(auVar28[0] & 1) << 0x1a |
                                     (uint)(auVar29[0] & 1) << 0x1b | (uint)(auVar30[0] & 1) << 0x1c
                                     | (uint)(auVar31[0] & 1) << 0x1d |
                                     (uint)(auVar32[0] & 1) << 0x1e | (uint)(bVar33 >> 7) << 0x1f);
        lVar39 = lVar39 + -4;
      } while (lVar39 != 0);
      uVar37 = uVar38;
      uVar36 = uVar38 + 2;
    } while (uVar38 + 2 <= (ulong)(len >> 4));
    uVar38 = uVar38 << 4;
  }
  if (uVar38 < len) {
    auVar42 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar43 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar44 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar38 = uVar38 + 1;
      auVar45 = vpbroadcastd_avx512f();
      auVar45 = vpsrlvd_avx512f(auVar45,auVar43);
      auVar45 = vpandd_avx512f(auVar45,auVar44);
      auVar42 = vpaddd_avx512f(auVar45,auVar42);
    } while (len != uVar38);
    auVar42 = vmovdqu64_avx512f(auVar42);
    *(undefined1 (*) [64])flags = auVar42;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m256i v0 = _mm256_loadu_si256(data_vectors + i + 0);
        __m256i v1 = _mm256_loadu_si256(data_vectors + i + 1);
        __m256i input0 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v1, 8));
        __m256i input1 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v1, 8));
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input0));
            flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input1));
            input0 = _mm256_add_epi8(input0, input0);
            input1 = _mm256_add_epi8(input1, input1);
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
   
    return 0;
}